

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  int iVar1;
  _Elt_pointer pBVar2;
  SharedDepEntry *dep;
  pointer piVar3;
  pointer pLVar4;
  cmTarget *pcVar5;
  char *pcVar6;
  pointer piVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> emmitted;
  
  AddDirectLinkEntries(this);
  while (pBVar2 = (this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->BFSQueue).c.
        super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar2) {
    emmitted._M_t._M_impl._0_4_ = pBVar2->Index;
    emmitted._M_t._M_impl._4_4_ = *(undefined4 *)&pBVar2->field_0x4;
    emmitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pBVar2->LibDepends;
    std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
    pop_front(&(this->BFSQueue).c);
    FollowLinkEntry(this,(BFSEntry *)&emmitted);
  }
  while (dep = (this->SharedDepQueue).c.
               super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    HandleSharedDependency(this,dep);
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::pop_front(&(this->SharedDepQueue).c);
  }
  InferDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    fwrite("------------------------------------------------------------------------------\n",0x4f,1
           ,_stderr);
    if (this->HasConfig == false) {
      pcVar6 = "noconfig";
    }
    else {
      pcVar6 = (this->Config)._M_dataplus._M_p;
    }
    fprintf(_stderr,"Link dependency analysis for target %s, config %s\n",
            (this->Target->Name)._M_dataplus._M_p,pcVar6);
    DisplayConstraintGraph(this);
  }
  OrderLinkEntires(this);
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emmitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       emmitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar3 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (piVar7 == piVar3) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
                ((this->FinalLinkEntries).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->FinalLinkEntries).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if (this->DebugMode == true) {
        DisplayFinalEntries(this);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&emmitted._M_t);
      return &this->FinalLinkEntries;
    }
    iVar1 = piVar7[-1];
    pLVar4 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = pLVar4[iVar1].Target;
    i = iVar1;
    if ((pcVar5 == (cmTarget *)0x0) || (pcVar5->TargetTypeValue != SHARED_LIBRARY)) {
LAB_00448b61:
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::push_back(&this->FinalLinkEntries,pLVar4 + iVar1);
    }
    else {
      pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&emmitted,&i);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00448b61;
    }
    piVar7 = piVar7 + -1;
  } while( true );
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while(!this->BFSQueue.empty())
    {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
    }

  // Complete the search of shared library dependencies.
  while(!this->SharedDepQueue.empty())
    {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
    }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if(this->DebugMode)
    {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig?this->Config.c_str():"noconfig");
    this->DisplayConstraintGraph();
    }

  // Compute the final ordering.
  this->OrderLinkEntires();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emmitted;
  for(std::vector<int>::const_reverse_iterator
        li = this->FinalLinkOrder.rbegin(),
        le = this->FinalLinkOrder.rend();
      li != le; ++li)
    {
    int i = *li;
    LinkEntry const& e = this->EntryList[i];
    cmTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmTarget::SHARED_LIBRARY;
    if(!uniquify || emmitted.insert(i).second)
      {
      this->FinalLinkEntries.push_back(e);
      }
    }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Display the final set.
  if(this->DebugMode)
    {
    this->DisplayFinalEntries();
    }

  return this->FinalLinkEntries;
}